

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

QPlatformScreen * __thiscall
QKmsDevice::createScreenForConnector
          (QKmsDevice *this,drmModeResPtr resources,drmModeConnectorPtr connector,ScreenInfo *vinfo)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  qsizetype qVar15;
  const_reference __s2;
  char *pcVar16;
  QDebug *pQVar17;
  reference p_Var18;
  ulong uVar19;
  QString *pQVar20;
  QKmsPlane *pQVar21;
  undefined4 extraout_var;
  undefined4 *in_RCX;
  QKmsDevice *in_RDX;
  long in_RSI;
  QKmsDevice *in_RDI;
  long in_FS_OFFSET;
  QKmsPlane *kmsplane_1;
  QList<QKmsPlane> *__range4;
  uint planeId;
  QString *crtcPlanePair;
  QStringList *__range2;
  QKmsPlane *kmsplane;
  QList<QKmsPlane> *__range5;
  drmModePlane *plane_1;
  drmModePlaneRes *planeResources;
  int idx;
  QKmsPlane *plane;
  QList<QKmsPlane> *__range1;
  bool framebufferSizeSet;
  bool drmFormatExplicit;
  uint32_t drmFormat;
  int pheight;
  int pwidth;
  int refresh;
  int height;
  int width;
  int selected_mode;
  drmModeModeInfo *m;
  int i_1;
  int best;
  int configured;
  int current;
  int preferred;
  drmModeModeInfo *mode_1;
  int i;
  drmModeCrtcPtr crtc_1;
  drmModeEncoderPtr encoder;
  uint32_t crtc_id;
  OutputConfiguration configuration;
  int crtc;
  char16_t *str_10;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_5;
  char16_t *str_6;
  char16_t *str_7;
  char16_t *str_9;
  char16_t *str_8;
  iterator __end4;
  iterator __begin4;
  QStringList values;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList crtcPlanePairs;
  QString val;
  iterator __end5;
  iterator __begin5;
  bool ok;
  iterator __end1;
  iterator __begin1;
  QString planeListStr;
  QKmsOutput output;
  QByteArray fbsize;
  QSize framebufferSize;
  QString cloneSource;
  QByteArray formatStr;
  QSizeF physSize;
  QList<_drmModeModeInfo> modes;
  QByteArrayList vposComp;
  QByteArray vpos;
  QByteArray mode;
  QVariantMap userConnectorConfig;
  QMap<QString,_QMap<QString,_QVariant>_> userConfig;
  int configurationRefresh;
  QSize configurationSize;
  QByteArray connectorName;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_15;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_14;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_13;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_12;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_11;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_10;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_9;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  drmModeModeInfo crtc_mode;
  drmModeModeInfo configurationModeline;
  int in_stack_ffffffffffffee48;
  undefined2 in_stack_ffffffffffffee4c;
  undefined1 in_stack_ffffffffffffee4e;
  char in_stack_ffffffffffffee4f;
  ScreenInfo *in_stack_ffffffffffffee50;
  drmModeConnectorPtr in_stack_ffffffffffffee58;
  undefined4 in_stack_ffffffffffffee60;
  uint in_stack_ffffffffffffee64;
  QString *in_stack_ffffffffffffee68;
  drmModeConnectorPtr in_stack_ffffffffffffee70;
  undefined4 in_stack_ffffffffffffee78;
  undefined4 in_stack_ffffffffffffee7c;
  drmModeConnectorPtr in_stack_ffffffffffffee80;
  drmModeResPtr in_stack_ffffffffffffee88;
  undefined4 in_stack_ffffffffffffee90;
  undefined4 in_stack_ffffffffffffee94;
  char *in_stack_ffffffffffffee98;
  undefined4 in_stack_ffffffffffffeeb8;
  undefined4 in_stack_ffffffffffffeebc;
  bool local_10a6;
  bool local_10a5;
  uint32_t local_10a4;
  int local_10a0;
  int local_109c;
  int local_108c;
  int local_107c;
  int local_1078;
  int local_1074;
  int local_1070;
  int local_106c;
  int local_105c;
  int local_1044;
  QPlatformScreen *local_1018;
  char local_f08 [32];
  char local_ee8 [32];
  QKmsPlane *local_ec8;
  iterator local_ec0;
  iterator local_eb8;
  QChar local_eaa;
  QList<QString> local_ea8;
  QString *local_e90;
  const_iterator local_e88;
  const_iterator local_e80;
  QChar local_e72;
  undefined8 local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  char local_e40 [32];
  QString local_e20;
  char local_e08 [32];
  QKmsPlane *local_de8;
  iterator local_de0;
  iterator local_dd8;
  char local_dd0 [39];
  bool local_da9 [25];
  char local_d90 [38];
  QChar local_d6a;
  undefined1 local_d68 [24];
  QKmsPlane *local_d50;
  iterator local_d48;
  iterator local_d40;
  QString local_d38 [2];
  QDebug local_d00;
  QArrayDataPointer<char> local_cf8 [2];
  QArrayDataPointer<char> local_cc8 [3];
  QKmsOutput local_c80;
  QDebug local_b78;
  QDebug local_b70;
  QDebug local_b68;
  char local_b60 [32];
  char local_b40 [32];
  QArrayDataPointer<char16_t> local_b20 [3];
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  QSize local_ac0;
  QDebug local_a98;
  QArrayDataPointer<char16_t> local_a90 [2];
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 local_a50;
  QDebug local_a28;
  char local_a20 [32];
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 local_9b0 [24];
  QArrayDataPointer<char16_t> local_998 [3];
  undefined8 local_950;
  undefined8 local_948;
  undefined8 local_940;
  QDebug local_918;
  QDebug local_910;
  QDebug local_908;
  QArrayDataPointer<char16_t> local_900 [2];
  QArrayDataPointer<char16_t> local_8d0 [2];
  qreal local_898;
  qreal local_890;
  QSizeF local_888 [3];
  QDebug local_858 [5];
  QDebug local_830 [5];
  QDebug local_808 [5];
  QDebug local_7e0;
  QList<_drmModeModeInfo> local_7d8 [2];
  QDebug local_7a0 [5];
  QDebug local_778 [5];
  QDebug local_750;
  QArrayDataPointer<char16_t> local_748 [2];
  bool local_718 [24];
  bool local_700 [24];
  undefined8 local_6e8;
  QList<QByteArray> local_6e0;
  QArrayDataPointer<char16_t> local_6c8 [2];
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  QArrayDataPointer<char16_t> local_680 [2];
  QArrayDataPointer<char16_t> local_650 [2];
  undefined1 local_620 [248];
  char local_528 [32];
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  QArrayDataPointer<char16_t> local_4e8;
  undefined1 local_4d0 [24];
  QArrayDataPointer<char16_t> local_4b8 [3];
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined1 local_458 [32];
  undefined8 local_438;
  undefined8 local_430;
  uint32_t local_424 [11];
  QDebug local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  ulong local_3d0;
  undefined8 local_3c8;
  ulong local_3c0;
  undefined8 local_3b8;
  ulong local_3b0;
  undefined8 local_3a8;
  ulong local_3a0;
  undefined8 local_398;
  ulong local_390;
  undefined8 local_388;
  ulong local_380;
  undefined8 local_378;
  ulong local_370;
  undefined8 local_368;
  ulong local_360;
  undefined8 local_358;
  ulong local_350;
  undefined8 local_348;
  ulong local_340;
  undefined8 local_338;
  ulong local_330;
  undefined8 local_328;
  ulong local_320;
  undefined8 local_318;
  ulong local_310;
  undefined8 local_308;
  ulong local_300;
  undefined8 local_2f8;
  ulong local_2f0;
  undefined8 local_2e8;
  ulong local_2e0;
  QVariant local_2d8;
  QVariant local_2b8;
  QVariant local_298;
  QVariant local_278;
  QVariant local_258;
  QVariant local_238;
  QVariant local_218;
  QVariant local_1f8;
  QVariant local_1d8;
  QVariant local_1b8;
  int local_194 [17];
  QVariant local_150;
  QVariant local_130;
  QVariant local_110;
  QVariant local_f0;
  QVariant local_d0;
  QVariant local_b0;
  QVariant local_90;
  QVariant local_70;
  undefined1 local_4c [68];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3f0 = 0xaaaaaaaaaaaaaaaa;
  local_3e8 = 0xaaaaaaaaaaaaaaaa;
  local_3e0 = 0xaaaaaaaaaaaaaaaa;
  nameForConnector(in_stack_ffffffffffffee58);
  uVar5 = crtcForConnector((QKmsDevice *)
                           CONCAT44(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90),
                           in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
  if ((int)uVar5 < 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
               (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
    QMessageLogger::warning();
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                       (QByteArray *)in_stack_ffffffffffffee58);
    QDebug::~QDebug(&local_3f8);
    local_1018 = (QPlatformScreen *)0x0;
    goto LAB_00115032;
  }
  local_424[1] = 0xaaaaaaaa;
  local_424[2] = 0xaaaaaaaa;
  QSize::QSize((QSize *)in_stack_ffffffffffffee50);
  local_424[0] = 0;
  memset(local_4c,0xaa,0x44);
  local_430 = 0xaaaaaaaaaaaaaaaa;
  QKmsScreenConfig::outputSettings
            ((QKmsScreenConfig *)
             CONCAT17(in_stack_ffffffffffffee4f,
                      CONCAT16(in_stack_ffffffffffffee4e,
                               CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
  local_438 = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QByteArray *)in_stack_ffffffffffffee50);
  memset(local_458,0,8);
  QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)0x111b3a);
  QMap<QString,_QMap<QString,_QVariant>_>::value
            ((QMap<QString,_QMap<QString,_QVariant>_> *)in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,
             (QMap<QString,_QVariant> *)
             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x111b6c);
  QString::~QString((QString *)0x111b79);
  local_470 = 0xaaaaaaaaaaaaaaaa;
  local_468 = 0xaaaaaaaaaaaaaaaa;
  local_460 = 0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_4b8,(Data *)0x0,L"mode",4);
  QString::QString((QString *)in_stack_ffffffffffffee50,
                   (DataPointer *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_4e8,(Data *)0x0,L"preferred",9);
  QString::QString((QString *)in_stack_ffffffffffffee50,
                   (DataPointer *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
  QVariant::QVariant(&local_90,(QString *)local_4d0);
  QMap<QString,_QVariant>::value
            ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
  QVariant::toByteArray();
  QByteArray::toLower((QByteArray *)
                      CONCAT17(in_stack_ffffffffffffee4f,
                               CONCAT16(in_stack_ffffffffffffee4e,
                                        CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48
                                                ))));
  QByteArray::~QByteArray((QByteArray *)0x111cdb);
  QVariant::~QVariant(&local_70);
  QVariant::~QVariant(&local_90);
  QString::~QString((QString *)0x111d02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
  QString::~QString((QString *)0x111d1c);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
  local_4f0 = "off";
  bVar3 = operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                     (char **)in_stack_ffffffffffffee58);
  if (bVar3) {
    local_1044 = 0;
  }
  else {
    local_4f8 = "preferred";
    bVar3 = operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                       (char **)in_stack_ffffffffffffee58);
    if (bVar3) {
      local_1044 = 1;
    }
    else {
      local_500 = "current";
      bVar3 = operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                         ,(char **)in_stack_ffffffffffffee58);
      if (bVar3) {
        local_1044 = 2;
      }
      else {
        local_508 = "skip";
        bVar3 = operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (char **)in_stack_ffffffffffffee58);
        if (bVar3) {
          local_1044 = 3;
        }
        else {
          pcVar10 = QByteArray::constData((QByteArray *)0x111e1e);
          piVar11 = QSize::rwidth((QSize *)0x111e33);
          piVar12 = QSize::rheight((QSize *)0x111e48);
          iVar6 = __isoc99_sscanf(pcVar10,"%dx%d@%d",piVar11,piVar12,local_424);
          if (iVar6 == 3) {
            local_1044 = 4;
          }
          else {
            pcVar10 = QByteArray::constData((QByteArray *)0x111e93);
            piVar11 = QSize::rwidth((QSize *)0x111ea8);
            piVar12 = QSize::rheight((QSize *)0x111ebd);
            iVar6 = __isoc99_sscanf(pcVar10,"%dx%d",piVar11,piVar12);
            if (iVar6 == 2) {
              local_1044 = 4;
            }
            else {
              bVar3 = parseModeline((QByteArray *)
                                    CONCAT44(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90),
                                    (drmModeModeInfoPtr)in_stack_ffffffffffffee88);
              if (bVar3) {
                local_1044 = 5;
              }
              else {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (char *)in_stack_ffffffffffffee58,
                           (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                           (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                            CONCAT16(in_stack_ffffffffffffee4e,
                                                     CONCAT24(in_stack_ffffffffffffee4c,
                                                              in_stack_ffffffffffffee48))));
                pcVar10 = QByteArray::constData((QByteArray *)0x111f3e);
                pcVar16 = QByteArray::constData((QByteArray *)0x111f53);
                QMessageLogger::warning
                          (local_528,"Invalid mode \"%s\" for output %s",pcVar10,pcVar16);
                local_1044 = 1;
              }
            }
          }
        }
      }
    }
  }
  memset(local_620,0,0xf8);
  ScreenInfo::ScreenInfo(in_stack_ffffffffffffee50);
  ScreenInfo::operator=
            (in_stack_ffffffffffffee50,
             (ScreenInfo *)
             CONCAT17(in_stack_ffffffffffffee4f,
                      CONCAT16(in_stack_ffffffffffffee4e,
                               CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
  ScreenInfo::~ScreenInfo((ScreenInfo *)0x111fce);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_650,(Data *)0x0,L"virtualIndex",0xc);
  QString::QString((QString *)in_stack_ffffffffffffee50,
                   (DataPointer *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
  QVariant::QVariant(&local_d0,0x7fffffff);
  QMap<QString,_QVariant>::value
            ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
  uVar7 = QVariant::toInt((bool *)&local_b0);
  *in_RCX = uVar7;
  QVariant::~QVariant(&local_b0);
  QVariant::~QVariant(&local_d0);
  QString::~QString((QString *)0x1120ab);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_680,(Data *)0x0,L"virtualPos",10);
  QString::QString((QString *)in_stack_ffffffffffffee50,
                   (DataPointer *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
  bVar3 = QMap<QString,_QVariant>::contains
                    ((QMap<QString,_QVariant> *)
                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                     (QString *)in_stack_ffffffffffffee58);
  QString::~QString((QString *)0x112140);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
  if (bVar3) {
    local_698 = 0xaaaaaaaaaaaaaaaa;
    local_690 = 0xaaaaaaaaaaaaaaaa;
    local_688 = 0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_6c8,(Data *)0x0,L"virtualPos",10);
    QString::QString((QString *)in_stack_ffffffffffffee50,
                     (DataPointer *)
                     CONCAT17(in_stack_ffffffffffffee4f,
                              CONCAT16(in_stack_ffffffffffffee4e,
                                       CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)
                                      )));
    QVariant::QVariant((QVariant *)0x1121f6);
    QMap<QString,_QVariant>::value
              ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
               (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
    QVariant::toByteArray();
    QVariant::~QVariant(&local_f0);
    QVariant::~QVariant(&local_110);
    QString::~QString((QString *)0x112257);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
    local_6e0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_6e0.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    local_6e0.d.size = -0x5555555555555556;
    QByteArray::split((char)&local_6e0);
    qVar15 = QList<QByteArray>::size(&local_6e0);
    if (qVar15 == 2) {
      QList<QByteArray>::operator[]
                ((QList<QByteArray> *)in_stack_ffffffffffffee50,
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      QByteArray::trimmed((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffee4f,
                                   CONCAT16(in_stack_ffffffffffffee4e,
                                            CONCAT24(in_stack_ffffffffffffee4c,
                                                     in_stack_ffffffffffffee48))));
      QByteArray::toInt(local_700,0);
      QList<QByteArray>::operator[]
                ((QList<QByteArray> *)in_stack_ffffffffffffee50,
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      QByteArray::trimmed((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffee4f,
                                   CONCAT16(in_stack_ffffffffffffee4e,
                                            CONCAT24(in_stack_ffffffffffffee4c,
                                                     in_stack_ffffffffffffee48))));
      QByteArray::toInt(local_718,0);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffee50,
                     CONCAT13(in_stack_ffffffffffffee4f,
                              CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)),
                     in_stack_ffffffffffffee48);
      *(undefined8 *)(in_RCX + 1) = local_6e8;
      QByteArray::~QByteArray((QByteArray *)0x112369);
      QByteArray::~QByteArray((QByteArray *)0x112376);
    }
    QList<QByteArray>::~QList((QList<QByteArray> *)0x112383);
    QByteArray::~QByteArray((QByteArray *)0x112390);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_748,(Data *)0x0,L"primary",7);
  QString::QString((QString *)in_stack_ffffffffffffee50,
                   (DataPointer *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
  QVariant::QVariant((QVariant *)0x1123ff);
  QMap<QString,_QVariant>::value
            ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
  uVar4 = QVariant::toBool();
  uVar9 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffeebc);
  QVariant::~QVariant(&local_130);
  QVariant::~QVariant(&local_150);
  QString::~QString((QString *)0x11245c);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
  if ((uVar9 & 0x1000000) != 0) {
    *(undefined1 *)(in_RCX + 3) = 1;
  }
  uVar2 = *(uint *)(*(long *)(in_RSI + 0x18) + (long)(int)uVar5 * 4);
  if (local_1044 == 0) {
    local_2e8 = 0xaaaaaaaaaaaaaaaa;
    local_2e0 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
               (QLoggingCategory *)
               CONCAT17(in_stack_ffffffffffffee4f,
                        CONCAT16(in_stack_ffffffffffffee4e,
                                 CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_2e8), bVar3) {
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1124fe);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))),(char *)0x112517);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (QByteArray *)in_stack_ffffffffffffee58);
      QDebug::~QDebug(&local_750);
      local_2e0 = local_2e0 & 0xffffffffffffff00;
    }
    drmModeSetCrtc(in_RDI->m_dri_fd,uVar2,0,0,0,0,0,0);
    local_1018 = (QPlatformScreen *)0x0;
  }
  else if ((local_1044 == 1) && (*(int *)&(in_RDX->m_path).d.d == 2)) {
    local_2f8 = 0xaaaaaaaaaaaaaaaa;
    local_2f0 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
               (QLoggingCategory *)
               CONCAT17(in_stack_ffffffffffffee4f,
                        CONCAT16(in_stack_ffffffffffffee4e,
                                 CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_2f8), bVar3) {
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11262e);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))),(char *)0x112647);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (QByteArray *)in_stack_ffffffffffffee58);
      QDebug::~QDebug(local_778);
      local_2f0 = local_2f0 & 0xffffffffffffff00;
    }
    local_1018 = (QPlatformScreen *)0x0;
  }
  else if (local_1044 == 3) {
    local_308 = 0xaaaaaaaaaaaaaaaa;
    local_300 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
               (QLoggingCategory *)
               CONCAT17(in_stack_ffffffffffffee4f,
                        CONCAT16(in_stack_ffffffffffffee4e,
                                 CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_308), bVar3) {
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x112717);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))),(char *)0x112730);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (QByteArray *)in_stack_ffffffffffffee58);
      QDebug::~QDebug(local_7a0);
      local_300 = local_300 & 0xffffffffffffff00;
    }
    local_1018 = (QPlatformScreen *)0x0;
  }
  else {
    memset(local_194,0xaa,0x44);
    memset(local_194,0,0x44);
    lVar13 = drmModeGetEncoder(in_RDI->m_dri_fd,*(undefined4 *)((long)&in_RDX->_vptr_QKmsDevice + 4)
                              );
    if (lVar13 != 0) {
      lVar14 = drmModeGetCrtc(in_RDI->m_dri_fd,*(undefined4 *)(lVar13 + 8));
      drmModeFreeEncoder(lVar13);
      if (lVar14 == 0) {
        local_1018 = (QPlatformScreen *)0x0;
        goto LAB_0011500b;
      }
      if (*(int *)(lVar14 + 0x18) != 0) {
        memcpy(local_194,(void *)(lVar14 + 0x1c),0x44);
      }
      drmModeFreeCrtc(lVar14);
    }
    local_7d8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_7d8[0].d.ptr = (_drmModeModeInfo *)0xaaaaaaaaaaaaaaaa;
    local_7d8[0].d.size = -0x5555555555555556;
    QList<_drmModeModeInfo>::QList((QList<_drmModeModeInfo> *)0x1128c6);
    QList<_drmModeModeInfo>::reserve
              ((QList<_drmModeModeInfo> *)
               CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
               CONCAT44(uVar9,in_stack_ffffffffffffeeb8));
    local_318 = 0xaaaaaaaaaaaaaaaa;
    local_310 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
               (QLoggingCategory *)
               CONCAT17(in_stack_ffffffffffffee4f,
                        CONCAT16(in_stack_ffffffffffffee4e,
                                 CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
    while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_318), bVar3) {
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x112935);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))),(char *)0x11294e);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (QByteArray *)in_stack_ffffffffffffee58);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                         CONCAT13(in_stack_ffffffffffffee4f,
                                  CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                         CONCAT13(in_stack_ffffffffffffee4f,
                                  CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                         CONCAT13(in_stack_ffffffffffffee4f,
                                  CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
      QDebug::~QDebug(&local_7e0);
      local_310 = local_310 & 0xffffffffffffff00;
    }
    for (local_105c = 0; local_105c < (int)(in_RDX->m_path).d.size; local_105c = local_105c + 1) {
      local_328 = 0xaaaaaaaaaaaaaaaa;
      local_320 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_328), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x112a9e);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x112ab7
                  );
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT11(in_stack_ffffffffffffee4f,in_stack_ffffffffffffee4e));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT11(in_stack_ffffffffffffee4f,in_stack_ffffffffffffee4e));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,in_stack_ffffffffffffee4f);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::~QDebug(local_808);
        local_320 = local_320 & 0xffffffffffffff00;
      }
      QList<_drmModeModeInfo>::operator<<
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 (parameter_type)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
    }
    local_106c = -1;
    local_1070 = -1;
    local_1074 = -1;
    local_1078 = -1;
    qVar15 = QList<_drmModeModeInfo>::size(local_7d8);
    local_107c = (int)qVar15;
    while (local_107c = local_107c + -1, -1 < local_107c) {
      __s2 = QList<_drmModeModeInfo>::at
                       ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                        CONCAT17(in_stack_ffffffffffffee4f,
                                 CONCAT16(in_stack_ffffffffffffee4e,
                                          CONCAT24(in_stack_ffffffffffffee4c,
                                                   in_stack_ffffffffffffee48))));
      if (local_1044 == 4) {
        uVar9 = (uint)__s2->hdisplay;
        uVar8 = QSize::width((QSize *)0x112c55);
        if (((uVar9 == uVar8) &&
            (uVar1 = __s2->vdisplay, uVar9 = QSize::height((QSize *)0x112c7c), uVar1 == uVar9)) &&
           ((local_424[0] == 0 || (__s2->vrefresh == local_424[0])))) {
          local_1074 = local_107c;
        }
      }
      iVar6 = memcmp(local_194,__s2,0x44);
      if (iVar6 == 0) {
        local_1070 = local_107c;
      }
      if ((__s2->type & 8) != 0) {
        local_106c = local_107c;
      }
      local_1078 = local_107c;
    }
    if (local_1044 == 5) {
      QList<_drmModeModeInfo>::operator<<
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 (parameter_type)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      qVar15 = QList<_drmModeModeInfo>::size(local_7d8);
      local_1074 = (int)qVar15 + -1;
    }
    if ((local_1070 < 0) && (local_194[0] != 0)) {
      QList<_drmModeModeInfo>::operator<<
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 (parameter_type)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      qVar15 = QList<_drmModeModeInfo>::size(local_7d8);
      local_1070 = (int)qVar15 + -1;
    }
    if (local_1044 == 2) {
      local_1074 = local_1070;
    }
    local_108c = -1;
    if (local_1074 < 0) {
      if (local_106c < 0) {
        if (local_1070 < 0) {
          if (-1 < local_1078) {
            local_108c = local_1078;
          }
        }
        else {
          local_108c = local_1070;
        }
      }
      else {
        local_108c = local_106c;
      }
    }
    else {
      local_108c = local_1074;
    }
    if (local_108c < 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))));
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (QByteArray *)in_stack_ffffffffffffee58);
      QDebug::~QDebug(local_830);
      local_1018 = (QPlatformScreen *)0x0;
    }
    else {
      QList<_drmModeModeInfo>::operator[]
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      QList<_drmModeModeInfo>::operator[]
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      QList<_drmModeModeInfo>::operator[]
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      local_338 = 0xaaaaaaaaaaaaaaaa;
      local_330 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_338), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x112f62);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x112f7b
                  );
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,in_stack_ffffffffffffee4f);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (QByteArray *)in_stack_ffffffffffffee58);
        QDebug::~QDebug(local_858);
        local_330 = local_330 & 0xffffffffffffff00;
      }
      local_109c = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH",(bool *)0x0);
      if (local_109c == 0) {
        local_109c = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH",(bool *)0x0);
      }
      local_10a0 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT",(bool *)0x0);
      if (local_10a0 == 0) {
        local_10a0 = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT",(bool *)0x0);
      }
      local_888[0].wd = -NAN;
      local_888[0].ht = -NAN;
      QSizeF::QSizeF(local_888,(double)local_109c,(double)local_10a0);
      bVar3 = QSizeF::isEmpty(local_888);
      if (bVar3) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_8d0,(Data *)0x0,L"physicalWidth",0xd);
        QString::QString((QString *)in_stack_ffffffffffffee50,
                         (DataPointer *)
                         CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))));
        QVariant::QVariant((QVariant *)0x113178);
        QMap<QString,_QVariant>::value
                  ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                   (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        QVariant::toInt((bool *)&local_1b8);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_900,(Data *)0x0,L"physicalHeight",0xe);
        QString::QString((QString *)in_stack_ffffffffffffee50,
                         (DataPointer *)
                         CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))));
        QVariant::QVariant((QVariant *)0x113221);
        QMap<QString,_QVariant>::value
                  ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                   (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        QVariant::toInt((bool *)&local_1f8);
        QSize::QSize((QSize *)in_stack_ffffffffffffee50,
                     CONCAT13(in_stack_ffffffffffffee4f,
                              CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)),
                     in_stack_ffffffffffffee48);
        QSizeF::QSizeF((QSizeF *)in_stack_ffffffffffffee50,
                       (QSize *)CONCAT17(in_stack_ffffffffffffee4f,
                                         CONCAT16(in_stack_ffffffffffffee4e,
                                                  CONCAT24(in_stack_ffffffffffffee4c,
                                                           in_stack_ffffffffffffee48))));
        local_888[0].wd = local_898;
        local_888[0].ht = local_890;
        QVariant::~QVariant(&local_1f8);
        QVariant::~QVariant(&local_218);
        QString::~QString((QString *)0x1132c6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
        QVariant::~QVariant(&local_1b8);
        QVariant::~QVariant(&local_1d8);
        QString::~QString((QString *)0x1132fa);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
        bVar3 = QSizeF::isEmpty(local_888);
        if (bVar3) {
          QSizeF::setWidth(local_888,(double)*(uint *)((long)&(in_RDX->m_path).d.d + 4));
          QSizeF::setHeight(local_888,(double)*(uint *)&(in_RDX->m_path).d.ptr);
        }
      }
      local_348 = 0xaaaaaaaaaaaaaaaa;
      local_340 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_348), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1133ac);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x1133c5
                  );
        QMessageLogger::debug();
        pQVar17 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::QDebug(&local_910,pQVar17);
        ::operator<<((QDebug *)&local_908,(QSizeF *)&local_910);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (QByteArray *)in_stack_ffffffffffffee58);
        QDebug::~QDebug(&local_908);
        QDebug::~QDebug(&local_910);
        QDebug::~QDebug(&local_918);
        local_340 = local_340 & 0xffffffffffffff00;
      }
      local_950 = 0xaaaaaaaaaaaaaaaa;
      local_948 = 0xaaaaaaaaaaaaaaaa;
      local_940 = 0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_998,(Data *)0x0,L"format",6);
      QString::QString((QString *)in_stack_ffffffffffffee50,
                       (DataPointer *)
                       CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
      QString::QString((QString *)0x11351e);
      QVariant::QVariant(&local_258,(QString *)local_9b0);
      QMap<QString,_QVariant>::value
                ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      QVariant::toByteArray();
      QByteArray::toLower((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffee4f,
                                   CONCAT16(in_stack_ffffffffffffee4e,
                                            CONCAT24(in_stack_ffffffffffffee4c,
                                                     in_stack_ffffffffffffee48))));
      QByteArray::~QByteArray((QByteArray *)0x11358f);
      QVariant::~QVariant(&local_238);
      QVariant::~QVariant(&local_258);
      QString::~QString((QString *)0x1135b6);
      QString::~QString((QString *)0x1135c3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
      local_10a5 = true;
      bVar3 = QByteArray::isEmpty((QByteArray *)0x1135f0);
      if (bVar3) {
        local_10a4 = 0x34325258;
        local_10a5 = false;
      }
      else {
        local_9b8 = "xrgb8888";
        bVar3 = operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (char **)in_stack_ffffffffffffee58);
        if (bVar3) {
          local_10a4 = 0x34325258;
        }
        else {
          local_9c0 = "xbgr8888";
          bVar3 = operator==((QByteArray *)
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (char **)in_stack_ffffffffffffee58);
          if (bVar3) {
            local_10a4 = 0x34324258;
          }
          else {
            local_9c8 = "argb8888";
            bVar3 = operator==((QByteArray *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (char **)in_stack_ffffffffffffee58);
            if (bVar3) {
              local_10a4 = 0x34325241;
            }
            else {
              local_9d0 = "abgr8888";
              bVar3 = operator==((QByteArray *)
                                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                 (char **)in_stack_ffffffffffffee58);
              if (bVar3) {
                local_10a4 = 0x34324241;
              }
              else {
                local_9d8 = "rgb565";
                bVar3 = operator==((QByteArray *)
                                   CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                   (char **)in_stack_ffffffffffffee58);
                if (bVar3) {
                  local_10a4 = 0x36314752;
                }
                else {
                  local_9e0 = "bgr565";
                  bVar3 = operator==((QByteArray *)
                                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                     (char **)in_stack_ffffffffffffee58);
                  if (bVar3) {
                    local_10a4 = 0x36314742;
                  }
                  else {
                    local_9e8 = "xrgb2101010";
                    bVar3 = operator==((QByteArray *)
                                       CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                                       ,(char **)in_stack_ffffffffffffee58);
                    if (bVar3) {
                      local_10a4 = 0x30335258;
                    }
                    else {
                      local_9f0 = "xbgr2101010";
                      bVar3 = operator==((QByteArray *)
                                         CONCAT44(in_stack_ffffffffffffee64,
                                                  in_stack_ffffffffffffee60),
                                         (char **)in_stack_ffffffffffffee58);
                      if (bVar3) {
                        local_10a4 = 0x30334258;
                      }
                      else {
                        local_9f8 = "argb2101010";
                        bVar3 = operator==((QByteArray *)
                                           CONCAT44(in_stack_ffffffffffffee64,
                                                    in_stack_ffffffffffffee60),
                                           (char **)in_stack_ffffffffffffee58);
                        if (bVar3) {
                          local_10a4 = 0x30335241;
                        }
                        else {
                          local_a00 = "abgr2101010";
                          local_10a5 = operator==((QByteArray *)
                                                  CONCAT44(in_stack_ffffffffffffee64,
                                                           in_stack_ffffffffffffee60),
                                                  (char **)in_stack_ffffffffffffee58);
                          if (local_10a5) {
                            local_10a4 = 0x30334241;
                          }
                          else {
                            QMessageLogger::QMessageLogger
                                      ((QMessageLogger *)
                                       CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                                       ,(char *)in_stack_ffffffffffffee58,
                                       (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                                       (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                                        CONCAT16(in_stack_ffffffffffffee4e,
                                                                 CONCAT24(in_stack_ffffffffffffee4c,
                                                                          in_stack_ffffffffffffee48)
                                                                )));
                            pcVar10 = QByteArray::constData((QByteArray *)0x113872);
                            pcVar16 = QByteArray::constData((QByteArray *)0x113884);
                            QMessageLogger::warning
                                      (local_a20,"Invalid pixel format \"%s\" for output %s",pcVar10
                                       ,pcVar16);
                            local_10a4 = 0x34325258;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_358 = 0xaaaaaaaaaaaaaaaa;
      local_350 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_358), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11391f);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x113938
                  );
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           (QTextStreamFunction)
                           CONCAT17(in_stack_ffffffffffffee4f,
                                    CONCAT16(in_stack_ffffffffffffee4e,
                                             CONCAT24(in_stack_ffffffffffffee4c,
                                                      in_stack_ffffffffffffee48))));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           CONCAT13(in_stack_ffffffffffffee4f,
                                    CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                           (QTextStreamFunction)
                           CONCAT17(in_stack_ffffffffffffee4f,
                                    CONCAT16(in_stack_ffffffffffffee4e,
                                             CONCAT24(in_stack_ffffffffffffee4c,
                                                      in_stack_ffffffffffffee48))));
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,(bool)in_stack_ffffffffffffee4f);
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (QByteArray *)in_stack_ffffffffffffee58);
        QDebug::~QDebug(&local_a28);
        local_350 = local_350 & 0xffffffffffffff00;
      }
      local_a60 = 0xaaaaaaaaaaaaaaaa;
      local_a58 = 0xaaaaaaaaaaaaaaaa;
      local_a50 = 0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_a90,(Data *)0x0,L"clones",6);
      QString::QString((QString *)in_stack_ffffffffffffee50,
                       (DataPointer *)
                       CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
      QVariant::QVariant((QVariant *)0x113a86);
      QMap<QString,_QVariant>::value
                ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      QVariant::toString();
      QVariant::~QVariant(&local_278);
      QVariant::~QVariant(&local_298);
      QString::~QString((QString *)0x113ae7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
      bVar3 = QString::isEmpty((QString *)0x113b01);
      if (!bVar3) {
        local_368 = 0xaaaaaaaaaaaaaaaa;
        local_360 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                   (QLoggingCategory *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_368), bVar3) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x113b5f);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))),
                     (char *)0x113b78);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                             ,(QByteArray *)in_stack_ffffffffffffee58);
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                             ,(QString *)in_stack_ffffffffffffee58);
          QDebug::~QDebug(&local_a98);
          local_360 = local_360 & 0xffffffffffffff00;
        }
      }
      local_ac0.wd.m_i = -0x55555556;
      local_ac0.ht.m_i = -0x55555556;
      QSize::QSize((QSize *)in_stack_ffffffffffffee50);
      local_10a6 = false;
      local_ad8 = 0xaaaaaaaaaaaaaaaa;
      local_ad0 = 0xaaaaaaaaaaaaaaaa;
      local_ac8 = 0xaaaaaaaaaaaaaaaa;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_b20,(Data *)0x0,L"size",4);
      QString::QString((QString *)in_stack_ffffffffffffee50,
                       (DataPointer *)
                       CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
      QVariant::QVariant((QVariant *)0x113cac);
      QMap<QString,_QVariant>::value
                ((QMap<QString,_QVariant> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      QVariant::toByteArray();
      QByteArray::toLower((QByteArray *)
                          CONCAT17(in_stack_ffffffffffffee4f,
                                   CONCAT16(in_stack_ffffffffffffee4e,
                                            CONCAT24(in_stack_ffffffffffffee4c,
                                                     in_stack_ffffffffffffee48))));
      QByteArray::~QByteArray((QByteArray *)0x113d08);
      QVariant::~QVariant(&local_2b8);
      QVariant::~QVariant(&local_2d8);
      QString::~QString((QString *)0x113d2f);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)in_stack_ffffffffffffee50);
      bVar3 = QByteArray::isEmpty((QByteArray *)0x113d49);
      if (!bVar3) {
        in_stack_ffffffffffffee98 = QByteArray::constData((QByteArray *)0x113d5e);
        piVar11 = QSize::rwidth((QSize *)0x113d70);
        piVar12 = QSize::rheight((QSize *)0x113d82);
        iVar6 = __isoc99_sscanf(in_stack_ffffffffffffee98,"%dx%d",piVar11,piVar12);
        if (iVar6 == 2) {
          local_10a6 = hasAtomicSupport(in_RDI);
          if (!local_10a6) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                       (char *)in_stack_ffffffffffffee58,
                       (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                       (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                        CONCAT16(in_stack_ffffffffffffee4e,
                                                 CONCAT24(in_stack_ffffffffffffee4c,
                                                          in_stack_ffffffffffffee48))));
            QMessageLogger::warning
                      (local_b40,"Setting framebuffer size is only available with DRM atomic API");
          }
        }
        else {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))));
          pcVar10 = QByteArray::constData((QByteArray *)0x113e18);
          QMessageLogger::warning(local_b60,"Invalid framebuffer size \'%s\'",pcVar10);
        }
      }
      if (local_10a6 == false) {
        QList<_drmModeModeInfo>::operator[]
                  ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        QSize::setWidth((QSize *)in_stack_ffffffffffffee50,
                        CONCAT13(in_stack_ffffffffffffee4f,
                                 CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QList<_drmModeModeInfo>::operator[]
                  ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        QSize::setHeight((QSize *)in_stack_ffffffffffffee50,
                         CONCAT13(in_stack_ffffffffffffee4f,
                                  CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
      }
      local_378 = 0xaaaaaaaaaaaaaaaa;
      local_370 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_378), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x113edf);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x113ef8
                  );
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (QByteArray *)in_stack_ffffffffffffee58);
        pQVar17 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
        QDebug::QDebug(&local_b70,pQVar17);
        ::operator<<((QDebug *)&local_b68,(QSize *)&local_b70);
        QDebug::~QDebug(&local_b68);
        QDebug::~QDebug(&local_b70);
        QDebug::~QDebug(&local_b78);
        local_370 = local_370 & 0xffffffffffffff00;
      }
      memcpy(&local_c80,&DAT_00134d38,0xe8);
      QKmsOutput::QKmsOutput((QKmsOutput *)in_stack_ffffffffffffee50);
      QString::fromUtf8<void>((QByteArray *)in_stack_ffffffffffffee50);
      QString::operator=((QString *)in_stack_ffffffffffffee50,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))));
      QString::~QString((QString *)0x113ffe);
      local_c80.connector_id = *(uint32_t *)&in_RDX->_vptr_QKmsDevice;
      local_c80.physical_size.wd = local_888[0].wd;
      local_c80.physical_size.ht = local_888[0].ht;
      local_c80.preferred_mode = local_108c;
      if (-1 < local_106c) {
        local_c80.preferred_mode = local_106c;
      }
      local_c80.mode = local_108c;
      local_c80.mode_set = false;
      local_c80.crtc_index = uVar5;
      local_c80.crtc_id = uVar2;
      local_c80.saved_crtc = (drmModeCrtcPtr)drmModeGetCrtc(in_RDI->m_dri_fd,uVar2);
      QList<_drmModeModeInfo>::operator=
                ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                 (QList<_drmModeModeInfo> *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      local_c80.subpixel = *(int *)((long)&(in_RDX->m_path).d.ptr + 4);
      QArrayDataPointer<char>::QArrayDataPointer(local_cc8,(Data *)0x0,"DPMS",4);
      QByteArray::QByteArray
                ((QByteArray *)in_stack_ffffffffffffee50,
                 (DataPointer *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      local_c80.dpms_prop =
           connectorProperty((QKmsDevice *)
                             CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
                             in_stack_ffffffffffffee70,(QByteArray *)in_stack_ffffffffffffee68);
      QByteArray::~QByteArray((QByteArray *)0x114146);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)in_stack_ffffffffffffee50);
      QArrayDataPointer<char>::QArrayDataPointer(local_cf8,(Data *)0x0,"EDID",4);
      QByteArray::QByteArray
                ((QByteArray *)in_stack_ffffffffffffee50,
                 (DataPointer *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      local_c80.edid_blob =
           connectorPropertyBlob
                     (in_RDX,(drmModeConnectorPtr)
                             CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
                      (QByteArray *)in_stack_ffffffffffffee70);
      QByteArray::~QByteArray((QByteArray *)0x1141c1);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)in_stack_ffffffffffffee50);
      local_c80.wants_forced_plane = false;
      local_c80.forced_plane_id = 0;
      local_c80.forced_plane_set = false;
      local_c80.drm_format = local_10a4;
      local_c80.drm_format_requested_by_user = local_10a5;
      QString::operator=(&local_c80.clone_source,(QString *)&local_a60);
      local_c80.size = local_ac0;
      iVar6 = in_RDI->m_dri_fd;
      p_Var18 = QList<_drmModeModeInfo>::operator[]
                          ((QList<_drmModeModeInfo> *)in_stack_ffffffffffffee50,
                           CONCAT17(in_stack_ffffffffffffee4f,
                                    CONCAT16(in_stack_ffffffffffffee4e,
                                             CONCAT24(in_stack_ffffffffffffee4c,
                                                      in_stack_ffffffffffffee48))));
      iVar6 = drmModeCreatePropertyBlob(iVar6,p_Var18,0x44,&local_c80.mode_blob_id);
      if (iVar6 != 0) {
        local_388 = 0xaaaaaaaaaaaaaaaa;
        local_380 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                   (QLoggingCategory *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_388), bVar3) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1142d3);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))),
                     (char *)0x1142ec);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffee68,in_stack_ffffffffffffee98);
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffee50,
                             CONCAT13(in_stack_ffffffffffffee4f,
                                      CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c))
                            );
          QDebug::~QDebug(&local_d00);
          local_380 = local_380 & 0xffffffffffffff00;
        }
      }
      parseConnectorProperties
                ((QKmsDevice *)in_stack_ffffffffffffee70,
                 (uint32_t)((ulong)in_stack_ffffffffffffee68 >> 0x20),
                 (QKmsOutput *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      parseCrtcProperties((QKmsDevice *)in_stack_ffffffffffffee70,
                          (uint32_t)((ulong)in_stack_ffffffffffffee68 >> 0x20),
                          (QKmsOutput *)
                          CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      local_d38[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_d38[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_d38[0].d.size = -0x5555555555555556;
      QString::QString((QString *)0x1143b2);
      local_d40.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
      local_d40 = QList<QKmsPlane>::begin((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
      local_d48.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
      local_d48 = QList<QKmsPlane>::end((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
      while( true ) {
        local_d50 = local_d48.i;
        bVar3 = QList<QKmsPlane>::iterator::operator!=(&local_d40,local_d48);
        if (!bVar3) break;
        pQVar21 = QList<QKmsPlane>::iterator::operator*(&local_d40);
        if ((pQVar21->possibleCrtcs & 1 << ((byte)local_c80.crtc_index & 0x1f)) != 0) {
          QList<QKmsPlane>::append
                    ((QList<QKmsPlane> *)in_stack_ffffffffffffee50,
                     (parameter_type)
                     CONCAT17(in_stack_ffffffffffffee4f,
                              CONCAT16(in_stack_ffffffffffffee4e,
                                       CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)
                                      )));
          QString::number((uint)local_d68,pQVar21->id);
          QString::append((QString *)local_d38);
          QString::~QString((QString *)0x1144f5);
          QChar::QChar<char16_t,_true>(&local_d6a,L' ');
          QString::append((QChar)(char16_t)local_d38);
          if (((local_c80.eglfs_plane == (QKmsPlane *)0x0) && (pQVar21->type == PrimaryPlane)) &&
             (pQVar21->activeCrtcId == 0)) {
            assignPlane(&local_c80,pQVar21);
          }
        }
        QList<QKmsPlane>::iterator::operator++(&local_d40);
      }
      local_398 = 0xaaaaaaaaaaaaaaaa;
      local_390 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_398), bVar3) {
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1145c4);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                   (char *)in_stack_ffffffffffffee58,(int)((ulong)in_stack_ffffffffffffee50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_ffffffffffffee4f,
                                     CONCAT16(in_stack_ffffffffffffee4e,
                                              CONCAT24(in_stack_ffffffffffffee4c,
                                                       in_stack_ffffffffffffee48))),(char *)0x1145dd
                  );
        pcVar10 = QByteArray::constData((QByteArray *)0x1145ea);
        qVar15 = QList<QKmsPlane>::size(&local_c80.available_planes);
        uVar9 = (uint)qVar15;
        QtPrivate::asString(local_d38);
        QString::toLocal8Bit(in_stack_ffffffffffffee68);
        pcVar16 = QByteArray::constData((QByteArray *)0x114631);
        QMessageLogger::debug
                  (local_d90,"Output %s can use %d planes: %s",pcVar10,(ulong)uVar9,pcVar16);
        QByteArray::~QByteArray((QByteArray *)0x114660);
        local_390 = local_390 & 0xffffffffffffff00;
      }
      local_da9[0] = true;
      uVar9 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX",local_da9);
      if (((local_da9[0] & 1U) != 0) &&
         (piVar11 = (int *)drmModeGetPlaneResources(in_RDI->m_dri_fd), piVar11 != (int *)0x0)) {
        if (((int)uVar9 < 0) || (*piVar11 <= (int)uVar9)) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))));
          QMessageLogger::warning
                    (local_e08,"Invalid plane index %d, must be between 0 and %u",(ulong)uVar9,
                     (ulong)(*piVar11 - 1));
        }
        else {
          lVar13 = drmModeGetPlane(in_RDI->m_dri_fd,
                                   *(undefined4 *)(*(long *)(piVar11 + 2) + (long)(int)uVar9 * 4));
          if (lVar13 != 0) {
            local_c80.wants_forced_plane = true;
            local_c80.forced_plane_id = *(uint32_t *)(lVar13 + 0x10);
            local_3a8 = 0xaaaaaaaaaaaaaaaa;
            local_3a0 = 0xaaaaaaaaaaaaaaaa;
            qLcKmsDebug();
            anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                       (QLoggingCategory *)
                       CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
            while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_3a8), bVar3) {
              anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x114795);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                         (char *)in_stack_ffffffffffffee58,
                         (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                         (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                          CONCAT16(in_stack_ffffffffffffee4e,
                                                   CONCAT24(in_stack_ffffffffffffee4c,
                                                            in_stack_ffffffffffffee48))),
                         (char *)0x1147ae);
              QMessageLogger::debug
                        (local_dd0,"Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                         (ulong)uVar9,(ulong)*(uint *)(lVar13 + 0x10),
                         (ulong)*(uint *)(lVar13 + 0x14));
              local_3a0 = local_3a0 & 0xffffffffffffff00;
            }
            local_dd8.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
            local_dd8 = QList<QKmsPlane>::begin((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
            local_de0.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
            local_de0 = QList<QKmsPlane>::end((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
            while( true ) {
              local_de8 = local_de0.i;
              bVar3 = QList<QKmsPlane>::iterator::operator!=(&local_dd8,local_de0);
              if (!bVar3) break;
              pQVar21 = QList<QKmsPlane>::iterator::operator*(&local_dd8);
              if (pQVar21->id == local_c80.forced_plane_id) {
                assignPlane(&local_c80,pQVar21);
                break;
              }
              QList<QKmsPlane>::iterator::operator++(&local_dd8);
            }
            drmModeFreePlane(lVar13);
          }
        }
      }
      uVar19 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
      if ((uVar19 & 1) != 0) {
        local_e20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_e20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_e20.d.size = -0x5555555555555556;
        qEnvironmentVariable((char *)&local_e20);
        local_3b8 = 0xaaaaaaaaaaaaaaaa;
        local_3b0 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                   (QLoggingCategory *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_3b8), bVar3) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1149e9);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))),
                     (char *)0x114a02);
          QtPrivate::asString(&local_e20);
          QString::toLocal8Bit(in_stack_ffffffffffffee68);
          pcVar10 = QByteArray::constData((QByteArray *)0x114a2c);
          QMessageLogger::debug(local_e40,"crtc_id:plane_id override list: %s",pcVar10);
          QByteArray::~QByteArray((QByteArray *)0x114a52);
          local_3b0 = local_3b0 & 0xffffffffffffff00;
        }
        local_e70 = 0xaaaaaaaaaaaaaaaa;
        local_e68 = 0xaaaaaaaaaaaaaaaa;
        local_e60 = 0xaaaaaaaaaaaaaaaa;
        QChar::QChar<char16_t,_true>(&local_e72,L':');
        QFlags<Qt::SplitBehaviorFlags>::QFlags
                  ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffee50,
                   CONCAT13(in_stack_ffffffffffffee4f,
                            CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
        QString::split((QChar)(char16_t)&local_e70,(QFlags_conflict *)&local_e20,
                       (uint)(ushort)local_e72.ucs);
        local_e80.i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_e80 = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffee50);
        local_e88.i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_e88 = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffee50);
        while( true ) {
          local_e90 = local_e88.i;
          bVar3 = QList<QString>::const_iterator::operator!=(&local_e80,local_e88);
          if (!bVar3) break;
          pQVar20 = QList<QString>::const_iterator::operator*(&local_e80);
          local_ea8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_ea8.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
          local_ea8.d.size = -0x5555555555555556;
          QChar::QChar<char16_t,_true>(&local_eaa,L',');
          QFlags<Qt::SplitBehaviorFlags>::QFlags
                    ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffee50,
                     CONCAT13(in_stack_ffffffffffffee4f,
                              CONCAT12(in_stack_ffffffffffffee4e,in_stack_ffffffffffffee4c)));
          QString::split((QChar)(char16_t)&local_ea8,(QFlags_conflict *)pQVar20,
                         (uint)(ushort)local_eaa.ucs);
          qVar15 = QList<QString>::size(&local_ea8);
          if (qVar15 == 2) {
            QList<QString>::operator[]
                      ((QList<QString> *)in_stack_ffffffffffffee50,
                       CONCAT17(in_stack_ffffffffffffee4f,
                                CONCAT16(in_stack_ffffffffffffee4e,
                                         CONCAT24(in_stack_ffffffffffffee4c,
                                                  in_stack_ffffffffffffee48))));
            uVar9 = QString::toInt((QString *)in_stack_ffffffffffffee58,
                                   (bool *)in_stack_ffffffffffffee50,
                                   CONCAT13(in_stack_ffffffffffffee4f,
                                            CONCAT12(in_stack_ffffffffffffee4e,
                                                     in_stack_ffffffffffffee4c)));
            if (uVar9 == local_c80.crtc_id) {
              QList<QString>::operator[]
                        ((QList<QString> *)in_stack_ffffffffffffee50,
                         CONCAT17(in_stack_ffffffffffffee4f,
                                  CONCAT16(in_stack_ffffffffffffee4e,
                                           CONCAT24(in_stack_ffffffffffffee4c,
                                                    in_stack_ffffffffffffee48))));
              uVar5 = QString::toInt((QString *)in_stack_ffffffffffffee58,
                                     (bool *)in_stack_ffffffffffffee50,
                                     CONCAT13(in_stack_ffffffffffffee4f,
                                              CONCAT12(in_stack_ffffffffffffee4e,
                                                       in_stack_ffffffffffffee4c)));
              local_eb8.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
              local_eb8 = QList<QKmsPlane>::begin((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
              local_ec0.i = (QKmsPlane *)0xaaaaaaaaaaaaaaaa;
              local_ec0 = QList<QKmsPlane>::end((QList<QKmsPlane> *)in_stack_ffffffffffffee50);
              while( true ) {
                local_ec8 = local_ec0.i;
                bVar3 = QList<QKmsPlane>::iterator::operator!=(&local_eb8,local_ec0);
                if (!bVar3) break;
                pQVar21 = QList<QKmsPlane>::iterator::operator*(&local_eb8);
                if (pQVar21->id == uVar5) {
                  assignPlane(&local_c80,pQVar21);
                  break;
                }
                QList<QKmsPlane>::iterator::operator++(&local_eb8);
              }
            }
          }
          QList<QString>::~QList((QList<QString> *)0x114d9d);
          QList<QString>::const_iterator::operator++(&local_e80);
        }
        QList<QString>::~QList((QList<QString> *)0x114dbc);
        QString::~QString((QString *)0x114dc9);
      }
      if (local_c80.eglfs_plane != (QKmsPlane *)0x0) {
        local_3c8 = 0xaaaaaaaaaaaaaaaa;
        local_3c0 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                   (QLoggingCategory *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_3c8), bVar3) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x114e2b);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))),
                     (char *)0x114e44);
          in_stack_ffffffffffffee64 = (local_c80.eglfs_plane)->id;
          pcVar10 = QByteArray::constData((QByteArray *)0x114e5f);
          QMessageLogger::debug
                    (local_ee8,"Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                     (ulong)in_stack_ffffffffffffee64,pcVar10,(ulong)local_c80.crtc_id);
          local_3c0 = local_3c0 & 0xffffffffffffff00;
        }
      }
      bVar3 = hasAtomicSupport(in_RDI);
      if ((bVar3) && (local_c80.eglfs_plane == (QKmsPlane *)0x0)) {
        local_3d8 = 0xaaaaaaaaaaaaaaaa;
        local_3d0 = 0xaaaaaaaaaaaaaaaa;
        qLcKmsDebug();
        anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffee50,
                   (QLoggingCategory *)
                   CONCAT17(in_stack_ffffffffffffee4f,
                            CONCAT16(in_stack_ffffffffffffee4e,
                                     CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48)))
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_3d8), bVar3) {
          anon_unknown.dwarf_8e6c3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x114f0b);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                     ,(char *)in_stack_ffffffffffffee58,
                     (int)((ulong)in_stack_ffffffffffffee50 >> 0x20),
                     (char *)CONCAT17(in_stack_ffffffffffffee4f,
                                      CONCAT16(in_stack_ffffffffffffee4e,
                                               CONCAT24(in_stack_ffffffffffffee4c,
                                                        in_stack_ffffffffffffee48))),
                     (char *)0x114f24);
          pcVar10 = QByteArray::constData((QByteArray *)0x114f31);
          QMessageLogger::debug
                    (local_f08,
                     "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad."
                     ,pcVar10,(ulong)local_c80.crtc_id);
          local_3d0 = local_3d0 & 0xffffffffffffff00;
        }
      }
      in_RDI->m_crtc_allocator = 1 << ((byte)local_c80.crtc_index & 0x1f) | in_RDI->m_crtc_allocator
      ;
      QKmsOutput::operator=
                ((QKmsOutput *)in_stack_ffffffffffffee50,
                 (QKmsOutput *)
                 CONCAT17(in_stack_ffffffffffffee4f,
                          CONCAT16(in_stack_ffffffffffffee4e,
                                   CONCAT24(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48))));
      iVar6 = (*in_RDI->_vptr_QKmsDevice[5])(in_RDI,&local_c80);
      local_1018 = (QPlatformScreen *)CONCAT44(extraout_var,iVar6);
      QString::~QString((QString *)0x114fca);
      QKmsOutput::~QKmsOutput((QKmsOutput *)in_stack_ffffffffffffee50);
      QByteArray::~QByteArray((QByteArray *)0x114fe4);
      QString::~QString((QString *)0x114ff1);
      QByteArray::~QByteArray((QByteArray *)0x114ffe);
    }
    QList<_drmModeModeInfo>::~QList((QList<_drmModeModeInfo> *)0x11500b);
  }
LAB_0011500b:
  QByteArray::~QByteArray((QByteArray *)0x115018);
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x115025);
  QMap<QString,_QMap<QString,_QVariant>_>::~QMap
            ((QMap<QString,_QMap<QString,_QVariant>_> *)0x115032);
LAB_00115032:
  QByteArray::~QByteArray((QByteArray *)0x11503f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1018;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformScreen *QKmsDevice::createScreenForConnector(drmModeResPtr resources,
                                                      drmModeConnectorPtr connector,
                                                      ScreenInfo *vinfo)
{
    Q_ASSERT(vinfo);
    const QByteArray connectorName = nameForConnector(connector);

    const int crtc = crtcForConnector(resources, connector);
    if (crtc < 0) {
        qWarning() << "No usable crtc/encoder pair for connector" << connectorName;
        return nullptr;
    }

    OutputConfiguration configuration;
    QSize configurationSize;
    int configurationRefresh = 0;
    drmModeModeInfo configurationModeline;

    auto userConfig = m_screenConfig->outputSettings();
    QVariantMap userConnectorConfig = userConfig.value(QString::fromUtf8(connectorName));
    // default to the preferred mode unless overridden in the config
    const QByteArray mode = userConnectorConfig.value(QStringLiteral("mode"), QStringLiteral("preferred"))
        .toByteArray().toLower();
    if (mode == "off") {
        configuration = OutputConfigOff;
    } else if (mode == "preferred") {
        configuration = OutputConfigPreferred;
    } else if (mode == "current") {
        configuration = OutputConfigCurrent;
    } else if (mode == "skip") {
        configuration = OutputConfigSkip;
    } else if (sscanf(mode.constData(), "%dx%d@%d", &configurationSize.rwidth(), &configurationSize.rheight(),
                      &configurationRefresh) == 3)
    {
        configuration = OutputConfigMode;
    } else if (sscanf(mode.constData(), "%dx%d", &configurationSize.rwidth(), &configurationSize.rheight()) == 2) {
        configuration = OutputConfigMode;
    } else if (parseModeline(mode, &configurationModeline)) {
        configuration = OutputConfigModeline;
    } else {
        qWarning("Invalid mode \"%s\" for output %s", mode.constData(), connectorName.constData());
        configuration = OutputConfigPreferred;
    }

    *vinfo = ScreenInfo();
    vinfo->virtualIndex = userConnectorConfig.value(QStringLiteral("virtualIndex"), INT_MAX).toInt();
    if (userConnectorConfig.contains(QStringLiteral("virtualPos"))) {
        const QByteArray vpos = userConnectorConfig.value(QStringLiteral("virtualPos")).toByteArray();
        const QByteArrayList vposComp = vpos.split(',');
        if (vposComp.size() == 2)
            vinfo->virtualPos = QPoint(vposComp[0].trimmed().toInt(), vposComp[1].trimmed().toInt());
    }
    if (userConnectorConfig.value(QStringLiteral("primary")).toBool())
        vinfo->isPrimary = true;

    const uint32_t crtc_id = resources->crtcs[crtc];

    if (configuration == OutputConfigOff) {
        qCDebug(qLcKmsDebug) << "Turning off output" << connectorName;
        drmModeSetCrtc(m_dri_fd, crtc_id, 0, 0, 0, 0, 0, nullptr);
        return nullptr;
    }

    // Skip disconnected output
    if (configuration == OutputConfigPreferred && connector->connection == DRM_MODE_DISCONNECTED) {
        qCDebug(qLcKmsDebug) << "Skipping disconnected output" << connectorName;
        return nullptr;
    }

    if (configuration == OutputConfigSkip) {
        qCDebug(qLcKmsDebug) << "Skipping output" << connectorName;
        return nullptr;
    }

    // Get the current mode on the current crtc
    drmModeModeInfo crtc_mode;
    memset(&crtc_mode, 0, sizeof crtc_mode);
    if (drmModeEncoderPtr encoder = drmModeGetEncoder(m_dri_fd, connector->encoder_id)) {
        drmModeCrtcPtr crtc = drmModeGetCrtc(m_dri_fd, encoder->crtc_id);
        drmModeFreeEncoder(encoder);

        if (!crtc)
            return nullptr;

        if (crtc->mode_valid)
            crtc_mode = crtc->mode;

        drmModeFreeCrtc(crtc);
    }

    QList<drmModeModeInfo> modes;
    modes.reserve(connector->count_modes);
    qCDebug(qLcKmsDebug) << connectorName << "mode count:" << connector->count_modes
                         << "crtc index:" << crtc << "crtc id:" << crtc_id;
    for (int i = 0; i < connector->count_modes; i++) {
        const drmModeModeInfo &mode = connector->modes[i];
        qCDebug(qLcKmsDebug) << "mode" << i << mode.hdisplay << "x" << mode.vdisplay
                                  << '@' << mode.vrefresh << "hz";
        modes << connector->modes[i];
    }

    int preferred = -1;
    int current = -1;
    int configured = -1;
    int best = -1;

    for (int i = modes.size() - 1; i >= 0; i--) {
        const drmModeModeInfo &m = modes.at(i);

        if (configuration == OutputConfigMode
                && m.hdisplay == configurationSize.width()
                && m.vdisplay == configurationSize.height()
                && (!configurationRefresh || m.vrefresh == uint32_t(configurationRefresh)))
        {
            configured = i;
        }

        if (!memcmp(&crtc_mode, &m, sizeof m))
            current = i;

        if (m.type & DRM_MODE_TYPE_PREFERRED)
            preferred = i;

        best = i;
    }

    if (configuration == OutputConfigModeline) {
        modes << configurationModeline;
        configured = modes.size() - 1;
    }

    if (current < 0 && crtc_mode.clock != 0) {
        modes << crtc_mode;
        current = modes.size() - 1;
    }

    if (configuration == OutputConfigCurrent)
        configured = current;

    int selected_mode = -1;

    if (configured >= 0)
        selected_mode = configured;
    else if (preferred >= 0)
        selected_mode = preferred;
    else if (current >= 0)
        selected_mode = current;
    else if (best >= 0)
        selected_mode = best;

    if (selected_mode < 0) {
        qWarning() << "No modes available for output" << connectorName;
        return nullptr;
    } else {
        int width = modes[selected_mode].hdisplay;
        int height = modes[selected_mode].vdisplay;
        int refresh = modes[selected_mode].vrefresh;
        qCDebug(qLcKmsDebug) << "Selected mode" << selected_mode << ":" << width << "x" << height
                                  << '@' << refresh << "hz for output" << connectorName;
    }

    // physical size from connector < config values < env vars
    int pwidth = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_WIDTH");
    if (!pwidth)
        pwidth = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_WIDTH");
    int pheight = qEnvironmentVariableIntValue("QT_QPA_EGLFS_PHYSICAL_HEIGHT");
    if (!pheight)
        pheight = qEnvironmentVariableIntValue("QT_QPA_PHYSICAL_HEIGHT");
    QSizeF physSize(pwidth, pheight);
    if (physSize.isEmpty()) {
        physSize = QSize(userConnectorConfig.value(QStringLiteral("physicalWidth")).toInt(),
                         userConnectorConfig.value(QStringLiteral("physicalHeight")).toInt());
        if (physSize.isEmpty()) {
            physSize.setWidth(connector->mmWidth);
            physSize.setHeight(connector->mmHeight);
        }
    }
    qCDebug(qLcKmsDebug) << "Physical size is" << physSize << "mm" << "for output" << connectorName;

    const QByteArray formatStr = userConnectorConfig.value(QStringLiteral("format"), QString())
            .toByteArray().toLower();
    uint32_t drmFormat;
    bool drmFormatExplicit = true;
    if (formatStr.isEmpty()) {
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    } else if (formatStr == "xrgb8888") {
        drmFormat = DRM_FORMAT_XRGB8888;
    } else if (formatStr == "xbgr8888") {
        drmFormat = DRM_FORMAT_XBGR8888;
    } else if (formatStr == "argb8888") {
        drmFormat = DRM_FORMAT_ARGB8888;
    } else if (formatStr == "abgr8888") {
        drmFormat = DRM_FORMAT_ABGR8888;
    } else if (formatStr == "rgb565") {
        drmFormat = DRM_FORMAT_RGB565;
    } else if (formatStr == "bgr565") {
        drmFormat = DRM_FORMAT_BGR565;
    } else if (formatStr == "xrgb2101010") {
        drmFormat = DRM_FORMAT_XRGB2101010;
    } else if (formatStr == "xbgr2101010") {
        drmFormat = DRM_FORMAT_XBGR2101010;
    } else if (formatStr == "argb2101010") {
        drmFormat = DRM_FORMAT_ARGB2101010;
    } else if (formatStr == "abgr2101010") {
        drmFormat = DRM_FORMAT_ABGR2101010;
    } else {
        qWarning("Invalid pixel format \"%s\" for output %s", formatStr.constData(), connectorName.constData());
        drmFormat = DRM_FORMAT_XRGB8888;
        drmFormatExplicit = false;
    }
    qCDebug(qLcKmsDebug) << "Format is" << Qt::hex << drmFormat << Qt::dec << "requested_by_user =" << drmFormatExplicit
                         << "for output" << connectorName;

    const QString cloneSource = userConnectorConfig.value(QStringLiteral("clones")).toString();
    if (!cloneSource.isEmpty())
        qCDebug(qLcKmsDebug) << "Output" << connectorName << " clones output " << cloneSource;

    QSize framebufferSize;
    bool framebufferSizeSet = false;
    const QByteArray fbsize = userConnectorConfig.value(QStringLiteral("size")).toByteArray().toLower();
    if (!fbsize.isEmpty()) {
        if (sscanf(fbsize.constData(), "%dx%d", &framebufferSize.rwidth(), &framebufferSize.rheight()) == 2) {
#if QT_CONFIG(drm_atomic)
            if (hasAtomicSupport())
                framebufferSizeSet = true;
#endif
            if (!framebufferSizeSet)
                qWarning("Setting framebuffer size is only available with DRM atomic API");
        } else {
            qWarning("Invalid framebuffer size '%s'", fbsize.constData());
        }
    }
    if (!framebufferSizeSet) {
        framebufferSize.setWidth(modes[selected_mode].hdisplay);
        framebufferSize.setHeight(modes[selected_mode].vdisplay);
    }

    qCDebug(qLcKmsDebug) << "Output" << connectorName << "framebuffer size is " << framebufferSize;

    QKmsOutput output;
    output.name = QString::fromUtf8(connectorName);
    output.connector_id = connector->connector_id;
    output.crtc_index = crtc;
    output.crtc_id = crtc_id;
    output.physical_size = physSize;
    output.preferred_mode = preferred >= 0 ? preferred : selected_mode;
    output.mode = selected_mode;
    output.mode_set = false;
    output.saved_crtc = drmModeGetCrtc(m_dri_fd, crtc_id);
    output.modes = modes;
    output.subpixel = connector->subpixel;
    output.dpms_prop = connectorProperty(connector, QByteArrayLiteral("DPMS"));
    output.edid_blob = connectorPropertyBlob(connector, QByteArrayLiteral("EDID"));
    output.wants_forced_plane = false;
    output.forced_plane_id = 0;
    output.forced_plane_set = false;
    output.drm_format = drmFormat;
    output.drm_format_requested_by_user = drmFormatExplicit;
    output.clone_source = cloneSource;
    output.size = framebufferSize;

#if QT_CONFIG(drm_atomic)
    if (drmModeCreatePropertyBlob(m_dri_fd, &modes[selected_mode], sizeof(drmModeModeInfo),
                                  &output.mode_blob_id) != 0) {
        qCDebug(qLcKmsDebug) << "Failed to create mode blob for mode" << selected_mode;
    }

    parseConnectorProperties(output.connector_id, &output);
    parseCrtcProperties(output.crtc_id, &output);
#endif

    QString planeListStr;
    for (QKmsPlane &plane : m_planes) {
        if (plane.possibleCrtcs & (1 << output.crtc_index)) {
            output.available_planes.append(plane);
            planeListStr.append(QString::number(plane.id));
            planeListStr.append(u' ');

            // Choose the first primary plane that is not already assigned to
            // another screen's associated crtc.
            if (!output.eglfs_plane && plane.type == QKmsPlane::PrimaryPlane && !plane.activeCrtcId)
                assignPlane(&output, &plane);
        }
    }
    qCDebug(qLcKmsDebug, "Output %s can use %d planes: %s",
            connectorName.constData(), int(output.available_planes.size()), qPrintable(planeListStr));

    // This is for the EGLDevice/EGLStream backend. On some of those devices one
    // may want to target a pre-configured plane. It is probably useless for
    // eglfs_kms and others. Do not confuse with generic plane support (available_planes).
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_PLANE_INDEX", &ok);
    if (ok) {
        drmModePlaneRes *planeResources = drmModeGetPlaneResources(m_dri_fd);
        if (planeResources) {
            if (idx >= 0 && idx < int(planeResources->count_planes)) {
                drmModePlane *plane = drmModeGetPlane(m_dri_fd, planeResources->planes[idx]);
                if (plane) {
                    output.wants_forced_plane = true;
                    output.forced_plane_id = plane->plane_id;
                    qCDebug(qLcKmsDebug, "Forcing plane index %d, plane id %u (belongs to crtc id %u)",
                            idx, plane->plane_id, plane->crtc_id);

                    for (QKmsPlane &kmsplane : m_planes) {
                        if (kmsplane.id == output.forced_plane_id) {
                            assignPlane(&output, &kmsplane);
                            break;
                        }
                    }

                    drmModeFreePlane(plane);
                }
            } else {
                qWarning("Invalid plane index %d, must be between 0 and %u", idx, planeResources->count_planes - 1);
            }
        }
    }

    // A more useful version: allows specifying "crtc_id,plane_id:crtc_id,plane_id:..."
    // in order to allow overriding the plane used for a given crtc.
    if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS")) {
        const QString val = qEnvironmentVariable("QT_QPA_EGLFS_KMS_PLANES_FOR_CRTCS");
        qCDebug(qLcKmsDebug, "crtc_id:plane_id override list: %s", qPrintable(val));
        const QStringList crtcPlanePairs = val.split(u':');
        for (const QString &crtcPlanePair : crtcPlanePairs) {
            const QStringList values = crtcPlanePair.split(u',');
            if (values.size() == 2 && uint(values[0].toInt()) == output.crtc_id) {
                uint planeId = values[1].toInt();
                for (QKmsPlane &kmsplane : m_planes) {
                    if (kmsplane.id == planeId) {
                        assignPlane(&output, &kmsplane);
                        break;
                    }
                }
            }
        }
    }

    if (output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "Chose plane %u for output %s (crtc id %u) (may not be applicable)",
                output.eglfs_plane->id, connectorName.constData(), output.crtc_id);
    }

#if QT_CONFIG(drm_atomic)
    if (hasAtomicSupport() && !output.eglfs_plane) {
        qCDebug(qLcKmsDebug, "No plane associated with output %s (crtc id %u) and atomic modesetting is enabled. This is bad.",
                connectorName.constData(), output.crtc_id);
    }
#endif

    m_crtc_allocator |= (1 << output.crtc_index);

    vinfo->output = output;

    return createScreen(output);
}